

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O1

Aig_Obj_t * Aig_ObjCreate(Aig_Man_t *p,Aig_Obj_t *pGhost)

{
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *pVVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pObj;
  void **ppvVar5;
  int *piVar6;
  uint uVar7;
  size_t __size;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  
  if (((ulong)pGhost & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                  ,0x5c,"Aig_Obj_t *Aig_ObjCreate(Aig_Man_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pGhost->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsHash(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                  ,0x5d,"Aig_Obj_t *Aig_ObjCreate(Aig_Man_t *, Aig_Obj_t *)");
  }
  pObj = (Aig_Obj_t *)Aig_MmFixedEntryFetch(p->pMemObjs);
  (pObj->field_0).pNext = (Aig_Obj_t *)0x0;
  pObj->pFanin0 = (Aig_Obj_t *)0x0;
  pObj->pFanin1 = (Aig_Obj_t *)0x0;
  *(undefined8 *)&pObj->field_0x18 = 0;
  pObj->TravId = 0;
  pObj->Id = 0;
  (pObj->field_5).pData = (void *)0x0;
  pVVar1 = p->vObjs;
  uVar7 = pVVar1->nSize;
  pObj->Id = uVar7;
  uVar8 = pVVar1->nCap;
  if (uVar7 == uVar8) {
    if ((int)uVar8 < 0x10) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar1->pArray,0x80);
      }
      pVVar1->pArray = ppvVar5;
      iVar10 = 0x10;
    }
    else {
      iVar10 = uVar8 * 2;
      if (iVar10 <= (int)uVar8) goto LAB_006b9047;
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar1->pArray,(ulong)uVar8 << 4);
      }
      pVVar1->pArray = ppvVar5;
    }
    pVVar1->nCap = iVar10;
  }
LAB_006b9047:
  iVar10 = pVVar1->nSize;
  pVVar1->nSize = iVar10 + 1;
  pVVar1->pArray[iVar10] = pObj;
  *(ulong *)&pObj->field_0x18 =
       *(ulong *)&pObj->field_0x18 & 0xfffffffffffffff8 |
       (ulong)((uint)*(undefined8 *)&pGhost->field_0x18 & 7);
  Aig_ObjConnect(p,pObj,pGhost->pFanin0,pGhost->pFanin1);
  p->nObjs[*(uint *)&pObj->field_0x18 & 7] = p->nObjs[*(uint *)&pObj->field_0x18 & 7] + 1;
  if ((pObj->field_5).pData != (void *)0x0) {
    __assert_fail("pObj->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                  ,0x66,"Aig_Obj_t *Aig_ObjCreate(Aig_Man_t *, Aig_Obj_t *)");
  }
  pVVar2 = p->vProbs;
  if (pVVar2 == (Vec_Int_t *)0x0) {
    return pObj;
  }
  pAVar3 = pObj->pFanin0;
  if (pAVar3 == (Aig_Obj_t *)0x0) {
    uVar7 = 0xffffffff;
  }
  else {
    uVar7 = *(uint *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x24);
  }
  if (((int)uVar7 < 0) || (iVar10 = pVVar2->nSize, iVar10 <= (int)uVar7)) {
LAB_006b9240:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pObj->pFanin1;
  if (pAVar4 == (Aig_Obj_t *)0x0) {
    uVar8 = 0xffffffff;
  }
  else {
    uVar8 = *(uint *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x24);
  }
  if (((int)uVar8 < 0) || (iVar10 <= (int)uVar8)) goto LAB_006b9240;
  piVar6 = pVVar2->pArray;
  fVar13 = (float)piVar6[uVar7];
  if (((ulong)pAVar3 & 1) != 0) {
    fVar13 = 1.0 - fVar13;
  }
  fVar12 = (float)piVar6[uVar8];
  if (((ulong)pAVar4 & 1) != 0) {
    fVar12 = 1.0 - fVar12;
  }
  uVar7 = pObj->Id;
  if ((int)uVar7 < iVar10) goto LAB_006b9216;
  iVar10 = pVVar2->nCap;
  iVar11 = iVar10 * 2;
  iVar9 = (int)((long)(int)uVar7 + 1);
  if ((int)uVar7 < iVar11) {
    if (iVar10 < iVar11 && iVar10 <= (int)uVar7) {
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)iVar10 << 3);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)iVar10 << 3);
      }
      pVVar2->pArray = piVar6;
LAB_006b91c6:
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar2->nCap = iVar11;
    }
  }
  else if (iVar10 <= (int)uVar7) {
    __size = ((long)(int)uVar7 + 1) * 4;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(__size);
    }
    else {
      piVar6 = (int *)realloc(piVar6,__size);
    }
    pVVar2->pArray = piVar6;
    iVar11 = iVar9;
    goto LAB_006b91c6;
  }
  iVar10 = pVVar2->nSize;
  if (iVar10 <= (int)uVar7) {
    memset(pVVar2->pArray + iVar10,0,(ulong)(uVar7 - iVar10) * 4 + 4);
  }
  pVVar2->nSize = iVar9;
LAB_006b9216:
  if ((-1 < (int)uVar7) && ((int)uVar7 < pVVar2->nSize)) {
    pVVar2->pArray[uVar7] = (int)(fVar13 * fVar12);
    return pObj;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Aig_Obj_t * Aig_ObjCreate( Aig_Man_t * p, Aig_Obj_t * pGhost )
{
    Aig_Obj_t * pObj;
    assert( !Aig_IsComplement(pGhost) );
    assert( Aig_ObjIsHash(pGhost) );
//    assert( pGhost == &p->Ghost );
    // get memory for the new object
    pObj = Aig_ManFetchMemory( p );
    pObj->Type = pGhost->Type;
    // add connections
    Aig_ObjConnect( p, pObj, pGhost->pFanin0, pGhost->pFanin1 );
    // update node counters of the manager
    p->nObjs[Aig_ObjType(pObj)]++;
    assert( pObj->pData == NULL );
    // create the power counter
    if ( p->vProbs )
    {
        float Prob0 = Abc_Int2Float( Vec_IntEntry( p->vProbs, Aig_ObjFaninId0(pObj) ) );
        float Prob1 = Abc_Int2Float( Vec_IntEntry( p->vProbs, Aig_ObjFaninId1(pObj) ) );
        Prob0 = Aig_ObjFaninC0(pObj)? 1.0 - Prob0 : Prob0;
        Prob1 = Aig_ObjFaninC1(pObj)? 1.0 - Prob1 : Prob1;
        Vec_IntSetEntry( p->vProbs, pObj->Id, Abc_Float2Int(Prob0 * Prob1) );
    }
    return pObj;
}